

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextInput::matchRule(AspifTextInput *this,char c)

{
  Data *this_00;
  bool bVar1;
  char cVar2;
  int bound;
  
  if (c == '{') {
    match(this,"{",true);
    RuleBuilder::start(&this->data_->rule,(Head_t)0x1);
    matchAtoms(this,";,");
    match(this,"}",true);
  }
  else {
    RuleBuilder::start(&this->data_->rule,(Head_t)0x0);
    matchAtoms(this,";|");
  }
  bVar1 = match(this,":-",false);
  if (bVar1) {
    cVar2 = ProgramReader::peek(&this->super_ProgramReader,true);
    this_00 = this->data_;
    if (cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10) {
      bound = matchInt(this);
      RuleBuilder::startSum(&this_00->rule,bound);
      matchAgg(this);
    }
    else {
      RuleBuilder::startBody(&this_00->rule);
      matchLits(this);
    }
  }
  match(this,".",true);
  RuleBuilder::end(&this->data_->rule,this->out_);
  return;
}

Assistant:

void AspifTextInput::matchRule(char c) {
	if (c == '{') { match("{"); data_->rule.start(Head_t::Choice); matchAtoms(";,"); match("}"); }
	else          { data_->rule.start(); matchAtoms(";|"); }
	if (match(":-", false)) {
		c = peek(true);
		if (!StreamType::isDigit(c) && c != '-') {
			data_->rule.startBody();
			matchLits();
		}
		else {
			data_->rule.startSum(matchInt());
			matchAgg();
		}
	}
	match(".");
	data_->rule.end(out_);
}